

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteActions.cpp
# Opt level: O2

size_t __thiscall
MADPComponentDiscreteActions::GetNrJointActions(MADPComponentDiscreteActions *this)

{
  ostream *poVar1;
  E *pEVar2;
  stringstream ss;
  ostream local_188 [376];
  
  if (this->_m_initialized == false) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar1 = std::operator<<(local_188,"MADPComponentDiscreteActions::GetNrJointActions(");
    poVar1 = std::operator<<(poVar1,") - Error: not initialized. ");
    std::endl<char,std::char_traits<char>>(poVar1);
    pEVar2 = (E *)__cxa_allocate_exception(0x28);
    E::E(pEVar2,&ss);
    __cxa_throw(pEVar2,&E::typeinfo,E::~E);
  }
  if (this->_m_jointIndicesValid != false) {
    return this->_m_nrJointActions;
  }
  pEVar2 = (E *)__cxa_allocate_exception(0x28);
  E::E(pEVar2,
       "MADPComponentDiscreteActions::GetNrJointActions() joint indices are not available, overflow detected"
      );
  __cxa_throw(pEVar2,&E::typeinfo,E::~E);
}

Assistant:

size_t MADPComponentDiscreteActions::GetNrJointActions() const
{
    if(!_m_initialized)
    {
        stringstream ss;
            ss << "MADPComponentDiscreteActions::GetNrJointActions("<< 
            ") - Error: not initialized. "<<endl;
        throw E(ss);
    }
    if(!_m_jointIndicesValid)
    {
        throw(E("MADPComponentDiscreteActions::GetNrJointActions() joint indices are not available, overflow detected"));
    }
    return(_m_nrJointActions);
}